

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_Times(archive_read *a,_7z_header_info *h,int type)

{
  uint *puVar1;
  void *pvVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uchar *p;
  uchar *data;
  uchar *puVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  pvVar2 = a->format->data;
  lVar3 = *(long *)((long)pvVar2 + 0xa0);
  data = (uchar *)calloc(*(size_t *)((long)pvVar2 + 0x98),1);
  if (data == (uchar *)0x0) {
    return -1;
  }
  puVar7 = header_bytes(a,1);
  iVar11 = -1;
  if (puVar7 != (uchar *)0x0) {
    if (*puVar7 == '\0') {
      iVar5 = read_Bools(a,data,*(size_t *)((long)pvVar2 + 0x98));
      if (iVar5 < 0) goto LAB_001b14db;
    }
    else {
      memset(data,1,*(size_t *)((long)pvVar2 + 0x98));
    }
    puVar7 = header_bytes(a,1);
    if ((puVar7 != (uchar *)0x0) &&
       ((*puVar7 == '\0' ||
        ((iVar5 = parse_7zip_uint64(a,&h->dataIndex), -1 < iVar5 && (h->dataIndex < 0x5f5e101))))))
    {
      if (*(long *)((long)pvVar2 + 0x98) != 0) {
        uVar12 = 0;
        uVar14 = 1;
        do {
          if (data[uVar12] != '\0') {
            pbVar8 = header_bytes(a,8);
            if (pbVar8 == (byte *)0x0) {
              iVar11 = -1;
              goto LAB_001b14db;
            }
            if (type == 0x14) {
              uVar10 = (ulong)pbVar8[1] << 8 |
                       CONCAT44(*(undefined4 *)(pbVar8 + 4),
                                (uint)pbVar8[2] << 0x10 | (uint)pbVar8[3] << 0x18);
              lVar13 = uVar12 * 0x58 + lVar3;
              if (uVar10 < 0x19db1ded53e8000) {
                *(undefined8 *)(lVar13 + 0x20) = 0;
                lVar9 = 0;
              }
              else {
                uVar10 = (uVar10 | *pbVar8) + 0xfe624e212ac18000;
                *(ulong *)(lVar13 + 0x20) = uVar10 / 10000000;
                lVar9 = (uVar10 % 10000000) * 100;
              }
              *(long *)(lVar13 + 0x38) = lVar9;
              uVar6 = 1;
            }
            else if (type == 0x13) {
              uVar10 = (ulong)pbVar8[1] << 8 |
                       CONCAT44(*(undefined4 *)(pbVar8 + 4),
                                (uint)pbVar8[2] << 0x10 | (uint)pbVar8[3] << 0x18);
              lVar13 = uVar12 * 0x58 + lVar3;
              if (uVar10 < 0x19db1ded53e8000) {
                *(undefined8 *)(lVar13 + 0x28) = 0;
                lVar9 = 0;
              }
              else {
                uVar10 = (uVar10 | *pbVar8) + 0xfe624e212ac18000;
                *(ulong *)(lVar13 + 0x28) = uVar10 / 10000000;
                lVar9 = (uVar10 % 10000000) * 100;
              }
              *(long *)(lVar13 + 0x40) = lVar9;
              uVar6 = 2;
            }
            else {
              if (type != 0x12) goto LAB_001b14bf;
              uVar10 = (ulong)pbVar8[1] << 8 |
                       CONCAT44(*(undefined4 *)(pbVar8 + 4),
                                (uint)pbVar8[2] << 0x10 | (uint)pbVar8[3] << 0x18);
              lVar13 = uVar12 * 0x58 + lVar3;
              if (uVar10 < 0x19db1ded53e8000) {
                *(undefined8 *)(lVar13 + 0x30) = 0;
                lVar9 = 0;
              }
              else {
                uVar10 = (uVar10 | *pbVar8) + 0xfe624e212ac18000;
                *(ulong *)(lVar13 + 0x30) = uVar10 / 10000000;
                lVar9 = (uVar10 % 10000000) * 100;
              }
              *(long *)(lVar13 + 0x48) = lVar9;
              uVar6 = 4;
            }
            puVar1 = (uint *)(lVar3 + 0x18 + uVar12 * 0x58);
            *puVar1 = *puVar1 | uVar6;
          }
LAB_001b14bf:
          bVar4 = uVar14 < *(ulong *)((long)pvVar2 + 0x98);
          uVar12 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar4);
      }
      iVar11 = 0;
    }
  }
LAB_001b14db:
  free(data);
  return iVar11;
}

Assistant:

static int
read_Times(struct archive_read *a, struct _7z_header_info *h, int type)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7zip_entry *entries = zip->entries;
	unsigned char *timeBools;
	int allAreDefined;
	unsigned i;

	timeBools = calloc((size_t)zip->numFiles, sizeof(*timeBools));
	if (timeBools == NULL)
		return (-1);

	/* Read allAreDefined. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	allAreDefined = *p;
	if (allAreDefined)
		memset(timeBools, 1, (size_t)zip->numFiles);
	else {
		if (read_Bools(a, timeBools, (size_t)zip->numFiles) < 0)
			goto failed;
	}

	/* Read external. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p) {
		if (parse_7zip_uint64(a, &(h->dataIndex)) < 0)
			goto failed;
		if (UMAX_ENTRY < h->dataIndex)
			goto failed;
	}

	for (i = 0; i < zip->numFiles; i++) {
		if (!timeBools[i])
			continue;
		if ((p = header_bytes(a, 8)) == NULL)
			goto failed;
		switch (type) {
		case kCTime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].ctime),
			    &(entries[i].ctime_ns));
			entries[i].flg |= CTIME_IS_SET;
			break;
		case kATime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].atime),
			    &(entries[i].atime_ns));
			entries[i].flg |= ATIME_IS_SET;
			break;
		case kMTime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].mtime),
			    &(entries[i].mtime_ns));
			entries[i].flg |= MTIME_IS_SET;
			break;
		}
	}

	free(timeBools);
	return (0);
failed:
	free(timeBools);
	return (-1);
}